

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

IStreamingReporterPtr __thiscall
Catch::ReporterFactory<Catch::CompactReporter>::create
          (ReporterFactory<Catch::CompactReporter> *this,ReporterConfig *config)

{
  ReporterConfig *in_RDX;
  unique_ptr<Catch::CompactReporter> local_28 [2];
  ReporterConfig *config_local;
  ReporterFactory<Catch::CompactReporter> *this_local;
  
  config_local = config;
  this_local = this;
  Detail::make_unique<Catch::CompactReporter,Catch::ReporterConfig_const&>
            ((Detail *)local_28,in_RDX);
  Detail::unique_ptr<Catch::IStreamingReporter>::unique_ptr<Catch::CompactReporter,void>
            ((unique_ptr<Catch::IStreamingReporter> *)this,local_28);
  Detail::unique_ptr<Catch::CompactReporter>::~unique_ptr(local_28);
  return (IStreamingReporterPtr)(IStreamingReporter *)this;
}

Assistant:

IStreamingReporterPtr create( ReporterConfig const& config ) const override {
            return Detail::make_unique<T>( config );
        }